

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O0

char32_t jsonnet::internal::decode_utf16_surrogates
                   (LocationRange *loc,unsigned_long high,unsigned_long low)

{
  undefined8 uVar1;
  ulong in_RDX;
  ulong in_RSI;
  stringstream ss;
  string *in_stack_fffffffffffffe30;
  LocationRange *in_stack_fffffffffffffe38;
  StaticError *in_stack_fffffffffffffe40;
  stringstream local_1a0 [16];
  ostream local_190 [400];
  
  if ((((0xd7ff < in_RSI) && (in_RSI < 0xdc00)) && (0xdbff < in_RDX)) && (in_RDX < 0xe000)) {
    return (int)((in_RSI & 0x3ff) << 10) + 0x10000 + ((uint)in_RDX & 0x3ff);
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"Invalid UTF-16 bytes");
  uVar1 = __cxa_allocate_exception(0x60);
  std::__cxx11::stringstream::str();
  StaticError::StaticError
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  __cxa_throw(uVar1,&StaticError::typeinfo,StaticError::~StaticError);
}

Assistant:

char32_t decode_utf16_surrogates(const LocationRange &loc, const unsigned long high, const unsigned long low)
{
    if (high >= 0xd800 && high < 0xdc00 && low >= 0xdc00 && low < 0xe000) {
        return 0x10000 + ((high & 0x03ff) << 10) + (low & 0x03ff);
    } else {
        std::stringstream ss;
        ss << "Invalid UTF-16 bytes";
        throw StaticError(loc, ss.str());
    }
}